

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dotlockUnlock(sqlite3_file *id,int eFileLock)

{
  sqlite3_io_methods *psVar1;
  int *piVar2;
  int local_34;
  int tErrno;
  int rc;
  char *zLockFile;
  unixFile *pFile;
  int eFileLock_local;
  sqlite3_file *id_local;
  
  psVar1 = id[5].pMethods;
  if ((uint)*(byte *)((long)&id[3].pMethods + 4) == eFileLock) {
    id_local._4_4_ = 0;
  }
  else if (eFileLock == 1) {
    *(undefined1 *)((long)&id[3].pMethods + 4) = 1;
    id_local._4_4_ = 0;
  }
  else {
    local_34 = (*aSyscall[0x13].pCurrent)(psVar1);
    if (local_34 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 == 0x14) {
        local_34 = (*aSyscall[0x10].pCurrent)(psVar1);
      }
    }
    if (local_34 < 0) {
      piVar2 = __errno_location();
      local_34 = 0;
      if (*piVar2 != 2) {
        local_34 = 0x80a;
      }
      if ((local_34 != 0) && (local_34 != 5)) {
        *(int *)&id[4].pMethods = *piVar2;
      }
      id_local._4_4_ = local_34;
    }
    else {
      *(undefined1 *)((long)&id[3].pMethods + 4) = 0;
      id_local._4_4_ = 0;
    }
  }
  return id_local._4_4_;
}

Assistant:

static int dotlockUnlock(sqlite3_file *id, int eFileLock) {
  unixFile *pFile = (unixFile*)id;
  char *zLockFile = (char *)pFile->lockingContext;
  int rc;

  assert( pFile );
  OSTRACE(("UNLOCK  %d %d was %d pid=%d (dotlock)\n", pFile->h, eFileLock,
           pFile->eFileLock, getpid()));
  assert( eFileLock<=SHARED_LOCK );
  
  /* no-op if possible */
  if( pFile->eFileLock==eFileLock ){
    return SQLITE_OK;
  }

  /* To downgrade to shared, simply update our internal notion of the
  ** lock state.  No need to mess with the file on disk.
  */
  if( eFileLock==SHARED_LOCK ){
    pFile->eFileLock = SHARED_LOCK;
    return SQLITE_OK;
  }
  
  /* To fully unlock the database, delete the lock file */
  assert( eFileLock==NO_LOCK );
  rc = osRmdir(zLockFile);
  if( rc<0 && errno==ENOTDIR ) rc = osUnlink(zLockFile);
  if( rc<0 ){
    int tErrno = errno;
    rc = 0;
    if( ENOENT != tErrno ){
      rc = SQLITE_IOERR_UNLOCK;
    }
    if( IS_LOCK_ERROR(rc) ){
      pFile->lastErrno = tErrno;
    }
    return rc; 
  }
  pFile->eFileLock = NO_LOCK;
  return SQLITE_OK;
}